

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_session.cc
# Opt level: O3

void SSL_SESSION_get0_ocsp_response(SSL_SESSION *session,uint8_t **out,size_t *out_len)

{
  CRYPTO_BUFFER *buf;
  uint8_t *puVar1;
  size_t sVar2;
  
  buf = (session->ocsp_response)._M_t.
        super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl;
  if (buf == (CRYPTO_BUFFER *)0x0) {
    *out = (uint8_t *)0x0;
    sVar2 = 0;
  }
  else {
    puVar1 = CRYPTO_BUFFER_data(buf);
    *out = puVar1;
    sVar2 = CRYPTO_BUFFER_len((session->ocsp_response)._M_t.
                              super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
                              super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl);
  }
  *out_len = sVar2;
  return;
}

Assistant:

void SSL_SESSION_get0_ocsp_response(const SSL_SESSION *session,
                                    const uint8_t **out, size_t *out_len) {
  if (session->ocsp_response) {
    *out = CRYPTO_BUFFER_data(session->ocsp_response.get());
    *out_len = CRYPTO_BUFFER_len(session->ocsp_response.get());
  } else {
    *out = nullptr;
    *out_len = 0;
  }
}